

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Num.cpp
# Opt level: O3

Num * __thiscall Num::multiplyByPowerOfTen(Num *__return_storage_ptr__,Num *this,Short length)

{
  __return_storage_ptr__->size = 0;
  (__return_storage_ptr__->base)._M_dataplus._M_p = (pointer)&(__return_storage_ptr__->base).field_2
  ;
  (__return_storage_ptr__->base)._M_string_length = 0;
  (__return_storage_ptr__->base).field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::_M_assign((string *)&__return_storage_ptr__->base);
  std::__cxx11::string::_M_replace_aux
            ((ulong)&__return_storage_ptr__->base,(__return_storage_ptr__->base)._M_string_length,0,
             (char)length);
  __return_storage_ptr__->size = (Short)(__return_storage_ptr__->base)._M_string_length;
  return __return_storage_ptr__;
}

Assistant:

Num Num::multiplyByPowerOfTen(Short length) const // function of multiplication a number by certain power of ten
{
    Num res;
    res.base = base;
    res.base.append(length, '0');
    res.size = res.getSize();
    return res;
}